

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool slang::ast::requireLValueHelper<slang::ast::RangeSelectExpression>
               (RangeSelectExpression *expr,ASTContext *context,SourceLocation location,
               bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  string_view arg;
  bool bVar1;
  ValueExpressionBase *pVVar2;
  NetSymbol *pNVar3;
  SourceLocation in_RDX;
  EvalContext *in_RSI;
  RangeSelectExpression *in_RDI;
  RangeSelectExpression *in_R8;
  EvalContext evalCtx;
  ValueSymbol *sym;
  Diagnostic *diag;
  Expression *val;
  Type *in_stack_fffffffffffffaf8;
  Diagnostic *in_stack_fffffffffffffb00;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffb08;
  undefined5 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb15;
  undefined1 in_stack_fffffffffffffb16;
  undefined1 in_stack_fffffffffffffb17;
  SourceLocation in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  DiagCode in_stack_fffffffffffffb24;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  byte bVar4;
  ASTContext *in_stack_fffffffffffffb30;
  EvalContext *in_stack_fffffffffffffb38;
  Diagnostic *in_stack_fffffffffffffb40;
  bitmask<slang::ast::EvalFlags> flags_00;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  char *in_stack_fffffffffffffb50;
  bool local_4a2;
  bitmask<slang::ast::EvalFlags> local_491 [33];
  EvalContext *in_stack_fffffffffffffb90;
  RangeSelectExpression *in_stack_fffffffffffffb98;
  Expression *in_stack_fffffffffffffc58;
  ASTContext *in_stack_fffffffffffffc60;
  Expression *in_stack_fffffffffffffc68;
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffffc77;
  SourceLocation in_stack_fffffffffffffc78;
  Expression *in_stack_fffffffffffffe98;
  ASTContext *in_stack_fffffffffffffea0;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffffeaf;
  bitmask<slang::ast::EvalFlags> local_139 [64];
  bitmask<slang::ast::EvalFlags> local_f9 [41];
  bitmask<slang::ast::ASTFlags> local_d0;
  SourceLocation local_c8;
  SourceLocation local_c0;
  SourceLocation local_b8;
  undefined4 local_ac;
  SourceLocation local_a8;
  bitmask<slang::ast::AssignFlags> local_99;
  size_t local_98;
  char *local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  undefined4 local_74;
  ValueSymbol *local_70;
  SourceLocation local_68;
  SourceLocation local_60;
  SourceLocation local_58;
  undefined4 local_4c;
  Diagnostic *local_48;
  SourceLocation local_40;
  Expression *local_38;
  RangeSelectExpression *local_30;
  EvalContext *local_28;
  RangeSelectExpression *local_20;
  SourceLocation local_10;
  
  local_30 = in_R8;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_10 = in_RDX;
  local_38 = RangeSelectExpression::value(in_RDI);
  if ((local_38->kind == Concatenation) || (local_38->kind == Streaming)) {
    bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa2fcd0);
    if (!bVar1) {
      local_40 = SourceRange::start(&(local_20->super_Expression).sourceRange);
      local_10 = local_40;
    }
    local_4c = 0x560007;
    local_58 = local_10;
    local_48 = ASTContext::addDiag((ASTContext *)
                                   CONCAT17(in_stack_fffffffffffffb17,
                                            CONCAT16(in_stack_fffffffffffffb16,
                                                     CONCAT15(in_stack_fffffffffffffb15,
                                                              in_stack_fffffffffffffb10))),
                                   in_stack_fffffffffffffb24,in_stack_fffffffffffffb18);
    local_68 = (local_20->super_Expression).sourceRange.startLoc;
    local_60 = (local_20->super_Expression).sourceRange.endLoc;
    range.endLoc._0_5_ = in_stack_fffffffffffffb10;
    range.startLoc = (SourceLocation)in_stack_fffffffffffffb08;
    range.endLoc._5_1_ = in_stack_fffffffffffffb15;
    range.endLoc._6_1_ = in_stack_fffffffffffffb16;
    range.endLoc._7_1_ = in_stack_fffffffffffffb17;
    Diagnostic::operator<<(in_stack_fffffffffffffb00,range);
    return false;
  }
  bVar1 = ValueExpressionBase::isKind(local_38->kind);
  if (bVar1) {
    pVVar2 = Expression::as<slang::ast::ValueExpressionBase>(local_38);
    local_70 = pVVar2->symbol;
    if (((local_70->super_Symbol).kind == Net) &&
       (pNVar3 = Symbol::as<slang::ast::NetSymbol>((Symbol *)0xa2fdd7),
       pNVar3->netType->netKind == UserDefined)) {
      local_74 = 0xa80007;
      local_88 = (local_20->super_Expression).sourceRange.startLoc;
      local_80 = (local_20->super_Expression).sourceRange.endLoc;
      sourceRange.startLoc._4_2_ = in_stack_fffffffffffffb24.subsystem;
      sourceRange.startLoc._6_2_ = in_stack_fffffffffffffb24.code;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffb20;
      sourceRange.endLoc._0_7_ = in_stack_fffffffffffffb28;
      sourceRange.endLoc._7_1_ = in_stack_fffffffffffffb2f;
      ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffb18,
                          SUB84((ulong)in_stack_fffffffffffffb30 >> 0x20,0),sourceRange);
      local_98 = (local_70->super_Symbol).name._M_len;
      local_90 = (local_70->super_Symbol).name._M_str;
      arg._M_len._7_1_ = in_stack_fffffffffffffb4f;
      arg._M_len._0_7_ = in_stack_fffffffffffffb48;
      arg._M_str = in_stack_fffffffffffffb50;
      Diagnostic::operator<<(in_stack_fffffffffffffb40,arg);
      return false;
    }
    bitmask<slang::ast::AssignFlags>::bitmask(&local_99,NonBlocking);
    bVar1 = bitmask<slang::ast::AssignFlags>::has
                      ((bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffb00,
                       (bitmask<slang::ast::AssignFlags> *)in_stack_fffffffffffffaf8);
    local_4a2 = false;
    if (bVar1) {
      ValueSymbol::getType((ValueSymbol *)0xa2fec6);
      local_4a2 = Type::isDynamicallySizedArray(in_stack_fffffffffffffaf8);
    }
    if (local_4a2 != false) {
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0xa2feec);
      if (!bVar1) {
        local_a8 = SourceRange::start(&(local_20->super_Expression).sourceRange);
        local_10 = local_a8;
      }
      local_ac = 0x820007;
      local_b8 = local_10;
      ASTContext::addDiag((ASTContext *)
                          CONCAT17(in_stack_fffffffffffffb17,
                                   CONCAT16(in_stack_fffffffffffffb16,
                                            CONCAT15(in_stack_fffffffffffffb15,
                                                     in_stack_fffffffffffffb10))),
                          in_stack_fffffffffffffb24,in_stack_fffffffffffffb18);
      local_c8 = (local_20->super_Expression).sourceRange.startLoc;
      local_c0 = (local_20->super_Expression).sourceRange.endLoc;
      range_00.endLoc._0_5_ = in_stack_fffffffffffffb10;
      range_00.startLoc = (SourceLocation)in_stack_fffffffffffffb08;
      range_00.endLoc._5_1_ = in_stack_fffffffffffffb15;
      range_00.endLoc._6_1_ = in_stack_fffffffffffffb16;
      range_00.endLoc._7_1_ = in_stack_fffffffffffffb17;
      Diagnostic::operator<<(in_stack_fffffffffffffb00,range_00);
      return false;
    }
  }
  flags_00.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffb40 >> 0x38);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_d0,NonProcedural);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT17(in_stack_fffffffffffffb17,
                              CONCAT16(in_stack_fffffffffffffb16,
                                       CONCAT15(in_stack_fffffffffffffb15,in_stack_fffffffffffffb10)
                                      )),in_stack_fffffffffffffb08);
  if (bVar1) {
    RangeSelectExpression::left(local_20);
    local_f9[0].m_bits = '\0';
    bitmask<slang::ast::EvalFlags>::bitmask(local_f9);
    ASTContext::eval(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffeaf);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa30041);
    bVar4 = 1;
    if (bVar1) {
      RangeSelectExpression::right(local_20);
      local_139[0].m_bits = '\0';
      bitmask<slang::ast::EvalFlags>::bitmask(local_139);
      ASTContext::eval(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffeaf
                      );
      bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa300c2);
      bVar4 = bVar1 ^ 0xff;
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa300f3);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa30100);
    if ((bVar4 & 1) != 0) {
      return false;
    }
    if (local_30 == (RangeSelectExpression *)0x0) {
      local_30 = local_20;
    }
  }
  else {
    bitmask<slang::ast::EvalFlags>::bitmask(local_491,CacheResults);
    EvalContext::EvalContext(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,flags_00);
    bVar1 = RangeSelectExpression::isConstantSelect
                      (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
    if (bVar1) {
      if (local_30 == (RangeSelectExpression *)0x0) {
        local_30 = local_20;
      }
    }
    else {
      local_30 = (RangeSelectExpression *)0x0;
    }
    EvalContext::~EvalContext(local_28);
  }
  bVar1 = Expression::requireLValue
                    (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60,in_stack_fffffffffffffc78,
                     in_stack_fffffffffffffc77,in_stack_fffffffffffffc58);
  return bVar1;
}

Assistant:

bool requireLValueHelper(const T& expr, const ASTContext& context, SourceLocation location,
                         bitmask<AssignFlags> flags, const Expression* longestStaticPrefix) {
    auto& val = expr.value();
    if (val.kind == ExpressionKind::Concatenation || val.kind == ExpressionKind::Streaming) {
        // Selects of concatenations are not allowed to be lvalues.
        if (!location)
            location = expr.sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag << expr.sourceRange;
        return false;
    }

    if (ValueExpressionBase::isKind(val.kind)) {
        auto& sym = val.template as<ValueExpressionBase>().symbol;
        if (sym.kind == SymbolKind::Net) {
            if (sym.template as<NetSymbol>().netType.netKind == NetType::UserDefined) {
                context.addDiag(diag::UserDefPartialDriver, expr.sourceRange) << sym.name;
                return false;
            }
        }

        if (flags.has(AssignFlags::NonBlocking) && sym.getType().isDynamicallySizedArray()) {
            if (!location)
                location = expr.sourceRange.start();

            context.addDiag(diag::NonblockingDynamicAssign, location) << expr.sourceRange;
            return false;
        }
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        if constexpr (std::is_same_v<T, RangeSelectExpression>) {
            if (!context.eval(expr.left()) || !context.eval(expr.right()))
                return false;
        }
        else {
            if (!context.eval(expr.selector()))
                return false;
        }

        if (!longestStaticPrefix)
            longestStaticPrefix = &expr;
    }
    else {
        EvalContext evalCtx(context, EvalFlags::CacheResults);
        if (expr.isConstantSelect(evalCtx)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = &expr;
        }
        else {
            longestStaticPrefix = nullptr;
        }
    }

    return val.requireLValue(context, location, flags, longestStaticPrefix);
}